

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

SigningResult __thiscall
wallet::LegacyScriptPubKeyMan::SignMessage
          (LegacyScriptPubKeyMan *this,string *message,PKHash *pkhash,string *str_sig)

{
  bool bVar1;
  int iVar2;
  pointer *__ptr;
  SigningResult SVar3;
  long in_FS_OFFSET;
  undefined1 local_58 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_50;
  CKeyID local_44;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58[0] = false;
  local_50._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  ToKeyID(&local_44,pkhash);
  iVar2 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1e])
                    (this,&local_44,local_58);
  SVar3 = PRIVATE_KEY_NOT_AVAILABLE;
  if ((char)iVar2 != '\0') {
    bVar1 = MessageSign((CKey *)local_58,message,str_sig);
    SVar3 = (uint)!bVar1 * 2;
  }
  if (local_50._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_50,
               local_50._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

SigningResult LegacyScriptPubKeyMan::SignMessage(const std::string& message, const PKHash& pkhash, std::string& str_sig) const
{
    CKey key;
    if (!GetKey(ToKeyID(pkhash), key)) {
        return SigningResult::PRIVATE_KEY_NOT_AVAILABLE;
    }

    if (MessageSign(key, message, str_sig)) {
        return SigningResult::OK;
    }
    return SigningResult::SIGNING_FAILED;
}